

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::extract_global_variables_from_function
          (CompilerMSL *this,uint32_t func_id,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *added_arg_ids,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *global_var_ids,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *processed_func_ids)

{
  bool bVar1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *puVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  ExecutionModel EVar8;
  SPIRFunction *this_00;
  size_type sVar9;
  mapped_type *pmVar10;
  reference puVar11;
  SPIRVariable *pSVar12;
  SPIRType *args;
  Decoration *pDVar13;
  mapped_type *pmVar14;
  mapped_type *this_01;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar15;
  TypedID<(spirv_cross::Types)0> local_3c4;
  TypedID<(spirv_cross::Types)0> local_3c0;
  allocator local_3b9;
  string local_3b8 [32];
  string local_398 [32];
  undefined1 local_378 [36];
  ID local_354;
  int local_350 [2];
  ID local_348;
  TypeID local_344;
  uint32_t local_340;
  TypedID<(spirv_cross::Types)0> local_33c;
  uint32_t next_id_1;
  StorageClass local_334;
  ID local_330;
  TypeID local_32c;
  SPIRType *local_328;
  SPIRType *ptr;
  uint32_t local_318;
  uint32_t var_id;
  uint32_t ptr_type_id;
  uint32_t next_ids;
  bool is_builtin;
  TypedID *pTStack_308;
  BuiltIn builtin;
  TypedID<(spirv_cross::Types)1> *mbr_type_id;
  TypedID<(spirv_cross::Types)1> *__end5;
  TypedID<(spirv_cross::Types)1> *__begin5;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *__range5;
  uint32_t mbr_idx;
  StorageClass local_2dc;
  ID local_2d8;
  TypeID local_2d4;
  uint32_t local_2d0;
  char local_2cc [4];
  uint32_t next_id;
  string name;
  ID local_2a4;
  ID local_2a0;
  uint32_t local_29c;
  SPIRType *pSStack_298;
  BuiltIn bi_type;
  SPIRType *p_type;
  SPIRVariable *pSStack_288;
  uint32_t type_id;
  SPIRVariable *var_1;
  iterator iStack_278;
  uint32_t arg_id_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range2_1;
  bool added_out;
  bool added_in;
  _Node_iterator_base<unsigned_int,_false> local_248;
  _Node_iterator_base<unsigned_int,_false> local_240;
  uint32_t local_234;
  SPIRVariable *local_230;
  SPIRVariable *var;
  _Rb_tree_const_iterator<unsigned_int> _Stack_220;
  uint32_t base_id_3;
  char local_218;
  _Node_iterator_base<unsigned_int,_false> local_210;
  _Node_iterator_base<unsigned_int,_false> local_208;
  _Base_ptr local_200;
  undefined1 local_1f8;
  _Node_iterator_base<unsigned_int,_false> local_1f0;
  _Node_iterator_base<unsigned_int,_false> local_1e8;
  uint32_t local_1dc;
  _Rb_tree_const_iterator<unsigned_int> _Stack_1d8;
  uint32_t base_id_2;
  undefined1 local_1d0;
  _Node_iterator_base<unsigned_int,_false> local_1c8;
  _Node_iterator_base<unsigned_int,_false> local_1c0;
  uint32_t local_1b4;
  _Rb_tree_const_iterator<unsigned_int> _Stack_1b0;
  uint32_t rvalue_id;
  char local_1a8;
  _Node_iterator_base<unsigned_int,_false> local_1a0;
  _Node_iterator_base<unsigned_int,_false> local_198;
  uint32_t local_18c;
  iterator iStack_188;
  uint32_t base_id_1;
  _Rb_tree_const_iterator<unsigned_int> local_180;
  undefined1 local_168 [8];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> inner_func_args;
  uint32_t inner_func_id;
  _Node_iterator_base<unsigned_int,_false> local_120;
  _Node_iterator_base<unsigned_int,_false> local_118;
  uint32_t local_110;
  uint local_10c;
  uint32_t arg_id;
  uint32_t arg_idx;
  char local_100;
  _Base_ptr local_f8;
  undefined1 local_f0;
  _Base_ptr local_e8;
  undefined1 local_e0;
  SPIRType *local_d8;
  SPIRType *type;
  char local_c8;
  _Node_iterator_base<unsigned_int,_false> local_c0;
  _Node_iterator_base<unsigned_int,_false> local_b8;
  uint32_t local_b0;
  uint local_ac;
  uint32_t base_id;
  Op op;
  uint32_t *ops;
  Instruction *i;
  Instruction *__end2;
  Instruction *__begin2;
  SmallVector<spirv_cross::Instruction,_8UL> *__range2;
  SPIRBlock *b;
  TypedID<(spirv_cross::Types)6> *pTStack_70;
  TypedID<(spirv_cross::Types)6> block;
  TypedID<(spirv_cross::Types)6> *__end1;
  TypedID<(spirv_cross::Types)6> *__begin1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)6>,_8UL> *__range1;
  SPIRFunction *func;
  _Node_iterator_base<unsigned_int,_false> local_40;
  _Node_iterator_base<unsigned_int,_false> local_38;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_30;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *processed_func_ids_local;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *global_var_ids_local;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *added_arg_ids_local;
  CompilerMSL *pCStack_10;
  uint32_t func_id_local;
  CompilerMSL *this_local;
  
  local_30 = processed_func_ids;
  processed_func_ids_local = global_var_ids;
  global_var_ids_local =
       (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        *)added_arg_ids;
  added_arg_ids_local._4_4_ = func_id;
  pCStack_10 = this;
  local_38._M_cur =
       (__node_type *)
       ::std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::find(processed_func_ids,(key_type *)((long)&added_arg_ids_local + 4));
  local_40._M_cur =
       (__node_type *)
       ::std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(local_30);
  bVar3 = ::std::__detail::operator!=(&local_38,&local_40);
  if (bVar3) {
    pmVar10 = ::std::
              unordered_map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
              ::operator[](&this->function_global_vars,(key_type *)((long)&added_arg_ids_local + 4))
    ;
    ::std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               global_var_ids_local,pmVar10);
  }
  else {
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert(local_30,(value_type *)((long)&added_arg_ids_local + 4));
    this_00 = Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,added_arg_ids_local._4_4_);
    __end1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>::begin
                       (&(this_00->blocks).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>);
    pTStack_70 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>::end
                           (&(this_00->blocks).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>);
    for (; puVar2 = global_var_ids_local, __end1 != pTStack_70; __end1 = __end1 + 1) {
      b._4_4_ = __end1->id;
      uVar6 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&b + 4));
      __range2 = (SmallVector<spirv_cross::Instruction,_8UL> *)
                 Compiler::get<spirv_cross::SPIRBlock>((Compiler *)this,uVar6);
      __begin2 = (Instruction *)&((SPIRBlock *)__range2)->ops;
      __end2 = VectorView<spirv_cross::Instruction>::begin
                         ((VectorView<spirv_cross::Instruction> *)__begin2);
      i = VectorView<spirv_cross::Instruction>::end
                    ((VectorView<spirv_cross::Instruction> *)__begin2);
      for (; __end2 != i; __end2 = __end2 + 1) {
        ops = (uint32_t *)__end2;
        _base_id = Compiler::stream((Compiler *)this,__end2);
        local_ac = (uint)(ushort)*ops;
        if (local_ac == 0x39) {
          for (local_10c = 3; local_10c < ops[2]; local_10c = local_10c + 1) {
            local_110 = _base_id[local_10c];
            local_118._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::find(processed_func_ids_local,&local_110);
            local_120._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::end(processed_func_ids_local);
            bVar3 = ::std::__detail::operator!=(&local_118,&local_120);
            if (bVar3) {
              ::std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
              insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     global_var_ids_local,&local_110);
            }
          }
          inner_func_args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = _base_id[2];
          ::std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     local_168);
          extract_global_variables_from_function
                    (this,inner_func_args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                     (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     local_168,processed_func_ids_local,local_30);
          puVar2 = global_var_ids_local;
          local_180._M_node =
               (_Base_ptr)
               ::std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
               begin((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     local_168);
          iStack_188 = ::std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       end((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)local_168);
          ::std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
          insert<std::_Rb_tree_const_iterator<unsigned_int>>
                    ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)
                     puVar2,local_180,(_Rb_tree_const_iterator<unsigned_int>)iStack_188._M_node);
          ::std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     local_168);
        }
        else if (local_ac == 0x3c) {
          var._4_4_ = _base_id[2];
          local_230 = Compiler::maybe_get_backing_variable((Compiler *)this,var._4_4_);
          bVar3 = false;
          if (local_230 != (SPIRVariable *)0x0) {
            local_234 = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&(local_230->super_IVariant).self);
            sVar9 = ::std::
                    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::count(&this->atomic_image_vars,&local_234);
            bVar3 = sVar9 != 0;
          }
          if (bVar3) {
            local_240._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::find(processed_func_ids_local,(key_type *)((long)&var + 4));
            local_248._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::end(processed_func_ids_local);
            bVar3 = ::std::__detail::operator!=(&local_240,&local_248);
            if (bVar3) {
              ::std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
              insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     global_var_ids_local,(value_type *)((long)&var + 4));
            }
          }
        }
        else if (local_ac == 0x3d) {
LAB_003e1247:
          local_b0 = _base_id[2];
          local_b8._M_cur =
               (__node_type *)
               ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::find(processed_func_ids_local,&local_b0);
          local_c0._M_cur =
               (__node_type *)
               ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::end(processed_func_ids_local);
          bVar3 = ::std::__detail::operator!=(&local_b8,&local_c0);
          if (bVar3) {
            pVar15 = ::std::
                     set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                     insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)global_var_ids_local,&local_b0);
            type = (SPIRType *)pVar15.first._M_node;
            local_c8 = pVar15.second;
          }
          local_d8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,*_base_id);
          if (((*(int *)&(local_d8->super_IVariant).field_0xc == 0x10) &&
              ((local_d8->image).dim == DimSubpassData)) &&
             ((bVar3 = Options::is_ios(&this->msl_options), !bVar3 ||
              (((this->msl_options).ios_use_framebuffer_fetch_subpasses & 1U) == 0)))) {
            if (this->builtin_frag_coord_id == 0) {
              __assert_fail("builtin_frag_coord_id != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                            ,0x562,
                            "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                           );
            }
            pVar15 = ::std::
                     set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                     insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)global_var_ids_local,&this->builtin_frag_coord_id);
            local_e8 = (_Base_ptr)pVar15.first._M_node;
            local_e0 = pVar15.second;
            if (((this->msl_options).multiview & 1U) == 0) {
              if (((this->msl_options).arrayed_subpass_input & 1U) != 0) {
                if (this->builtin_layer_id == 0) {
                  __assert_fail("builtin_layer_id != 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                                ,0x56d,
                                "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                               );
                }
                pVar15 = ::std::
                         set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                         insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)global_var_ids_local,&this->builtin_layer_id);
                _arg_id = pVar15.first._M_node;
                local_100 = pVar15.second;
              }
            }
            else {
              if (this->builtin_view_idx_id == 0) {
                __assert_fail("builtin_view_idx_id != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                              ,0x567,
                              "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                             );
              }
              pVar15 = ::std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)global_var_ids_local,&this->builtin_view_idx_id);
              local_f8 = (_Base_ptr)pVar15.first._M_node;
              local_f0 = pVar15.second;
            }
          }
        }
        else if (local_ac == 0x3e) {
          local_18c = *_base_id;
          local_198._M_cur =
               (__node_type *)
               ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::find(processed_func_ids_local,&local_18c);
          local_1a0._M_cur =
               (__node_type *)
               ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::end(processed_func_ids_local);
          bVar3 = ::std::__detail::operator!=(&local_198,&local_1a0);
          if (bVar3) {
            pVar15 = ::std::
                     set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                     insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)global_var_ids_local,&local_18c);
            _Stack_1b0 = pVar15.first._M_node;
            local_1a8 = pVar15.second;
          }
          local_1b4 = _base_id[1];
          local_1c0._M_cur =
               (__node_type *)
               ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::find(processed_func_ids_local,&local_1b4);
          local_1c8._M_cur =
               (__node_type *)
               ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::end(processed_func_ids_local);
          bVar3 = ::std::__detail::operator!=(&local_1c0,&local_1c8);
          if (bVar3) {
            pVar15 = ::std::
                     set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                     insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)global_var_ids_local,&local_1b4);
            _Stack_1d8 = pVar15.first._M_node;
            local_1d0 = pVar15.second;
          }
        }
        else {
          if (local_ac - 0x41 < 4) goto LAB_003e1247;
          if (local_ac == 0xa9) {
            local_1dc = _base_id[3];
            local_1e8._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::find(processed_func_ids_local,&local_1dc);
            local_1f0._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::end(processed_func_ids_local);
            bVar3 = ::std::__detail::operator!=(&local_1e8,&local_1f0);
            if (bVar3) {
              pVar15 = ::std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)global_var_ids_local,&local_1dc);
              local_200 = (_Base_ptr)pVar15.first._M_node;
              local_1f8 = pVar15.second;
            }
            local_1dc = _base_id[4];
            local_208._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::find(processed_func_ids_local,&local_1dc);
            local_210._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::end(processed_func_ids_local);
            bVar3 = ::std::__detail::operator!=(&local_208,&local_210);
            if (bVar3) {
              pVar15 = ::std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)global_var_ids_local,&local_1dc);
              _Stack_220 = pVar15.first._M_node;
              local_218 = pVar15.second;
            }
          }
        }
      }
    }
    pmVar10 = ::std::
              unordered_map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
              ::operator[](&this->function_global_vars,(key_type *)((long)&added_arg_ids_local + 4))
    ;
    ::std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
              (pmVar10,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       puVar2);
    uVar6 = added_arg_ids_local._4_4_;
    uVar7 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point)
    ;
    puVar2 = global_var_ids_local;
    if (uVar6 != uVar7) {
      bVar3 = false;
      bVar1 = false;
      __end2_1 = ::std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                 begin((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       global_var_ids_local);
      iStack_278 = ::std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::end((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)puVar2);
      while (bVar4 = ::std::operator!=(&__end2_1,&stack0xfffffffffffffd88), bVar4) {
        puVar11 = ::std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end2_1);
        var_1._4_4_ = *puVar11;
        pSStack_288 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,var_1._4_4_);
        p_type._4_4_ = TypedID::operator_cast_to_unsigned_int
                                 ((TypedID *)&(pSStack_288->super_IVariant).field_0xc);
        pSStack_298 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,p_type._4_4_);
        TypedID<(spirv_cross::Types)0>::TypedID(&local_2a0,var_1._4_4_);
        local_29c = Compiler::get_decoration((Compiler *)this,local_2a0,DecorationBuiltIn);
        bVar4 = Compiler::is_tessellation_shader((Compiler *)this);
        if ((bVar4) && (pSStack_288->storage == StorageClassInput)) {
LAB_003e1a41:
          TypedID<(spirv_cross::Types)0>::TypedID(&local_2a4,var_1._4_4_);
          bVar5 = Compiler::has_decoration((Compiler *)this,local_2a4,DecorationPatch);
          bVar4 = false;
          if (!bVar5) {
            bVar5 = is_patch_block(this,pSStack_298);
            bVar4 = false;
            if (!bVar5) {
              bVar5 = Compiler::is_builtin_variable((Compiler *)this,pSStack_288);
              bVar4 = true;
              if ((((bVar5) && (bVar4 = true, local_29c != 0)) && (bVar4 = true, local_29c != 1)) &&
                 ((bVar4 = true, local_29c != 3 && (bVar4 = true, local_29c != 4)))) {
                bVar4 = *(int *)&(pSStack_298->super_IVariant).field_0xc == 0xf;
              }
            }
          }
        }
        else {
          EVar8 = Compiler::get_execution_model((Compiler *)this);
          bVar4 = false;
          if ((EVar8 == ExecutionModelTessellationControl) &&
             (bVar4 = false, pSStack_288->storage == StorageClassOutput)) goto LAB_003e1a41;
        }
        if (bVar4) {
          ::std::__cxx11::string::string((string *)&next_id);
          if (pSStack_288->storage == StorageClassInput) {
            if (!bVar3) {
              ::std::__cxx11::string::operator=((string *)&next_id,"gl_in");
              var_1._4_4_ = TypedID::operator_cast_to_unsigned_int
                                      ((TypedID *)&this->stage_in_ptr_var_id);
              bVar3 = true;
              goto LAB_003e1c44;
            }
            local_2cc[0] = '\v';
            local_2cc[1] = '\0';
            local_2cc[2] = '\0';
            local_2cc[3] = '\0';
          }
          else {
            if (pSStack_288->storage == StorageClassOutput) {
              if (bVar1) {
                local_2cc[0] = '\v';
                local_2cc[1] = '\0';
                local_2cc[2] = '\0';
                local_2cc[3] = '\0';
                goto LAB_003e1d7b;
              }
              ::std::__cxx11::string::operator=((string *)&next_id,"gl_out");
              var_1._4_4_ = TypedID::operator_cast_to_unsigned_int
                                      ((TypedID *)&this->stage_out_ptr_var_id);
              bVar1 = true;
            }
LAB_003e1c44:
            pSVar12 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,var_1._4_4_);
            p_type._4_4_ = TypedID::operator_cast_to_unsigned_int
                                     ((TypedID *)&(pSVar12->super_IVariant).field_0xc);
            local_2d0 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1)
            ;
            TypedID<(spirv_cross::Types)1>::TypedID(&local_2d4,p_type._4_4_);
            TypedID<(spirv_cross::Types)0>::TypedID(&local_2d8,local_2d0);
            SPIRFunction::add_parameter(this_00,local_2d4,local_2d8,true);
            local_2dc = StorageClassFunction;
            mbr_idx = 0;
            Compiler::
            set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int,unsigned_int&>
                      ((Compiler *)this,local_2d0,(uint *)((long)&p_type + 4),&local_2dc,
                       (int *)&mbr_idx,(uint *)((long)&var_1 + 4));
            TypedID<(spirv_cross::Types)0>::TypedID
                      ((TypedID<(spirv_cross::Types)0> *)((long)&__range5 + 4),local_2d0);
            Compiler::set_name((Compiler *)this,__range5._4_4_,(string *)&next_id);
            local_2cc[0] = '\0';
            local_2cc[1] = '\0';
            local_2cc[2] = '\0';
            local_2cc[3] = '\0';
          }
LAB_003e1d7b:
          ::std::__cxx11::string::~string((string *)&next_id);
        }
        else {
          bVar4 = Compiler::is_builtin_variable((Compiler *)this,pSStack_288);
          if ((bVar4) && (*(int *)&(pSStack_298->super_IVariant).field_0xc == 0xf)) {
            p_type._4_4_ = Compiler::get_pointee_type_id((Compiler *)this,p_type._4_4_);
            pSStack_298 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,p_type._4_4_);
            __range5._0_4_ = 0;
            __begin5 = (TypedID<(spirv_cross::Types)1> *)&pSStack_298->member_types;
            __end5 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::begin
                               ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)__begin5
                               );
            mbr_type_id = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::end
                                    ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                                     __begin5);
            for (; __end5 != mbr_type_id; __end5 = __end5 + 1) {
              pTStack_308 = (TypedID *)__end5;
              next_ids = 0x7fffffff;
              ptr_type_id._3_1_ =
                   Compiler::is_member_builtin
                             ((Compiler *)this,pSStack_298,(uint32_t)__range5,&next_ids);
              if (((bool)ptr_type_id._3_1_) &&
                 (bVar4 = Compiler::has_active_builtin
                                    ((Compiler *)this,next_ids,pSStack_288->storage), bVar4)) {
                uVar6 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,2)
                ;
                ptr._4_4_ = uVar6 + 1;
                local_318 = uVar6;
                var_id = uVar6;
                uVar7 = TypedID::operator_cast_to_unsigned_int(pTStack_308);
                args = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar7);
                local_328 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                                      ((Compiler *)this,uVar6,args);
                TypedID<(spirv_cross::Types)0>::operator=
                          (&(local_328->super_IVariant).self,
                           (TypedID<(spirv_cross::Types)1> *)pTStack_308);
                local_328->storage = pSStack_288->storage;
                local_328->pointer = true;
                (local_328->parent_type).id = *(uint32_t *)pTStack_308;
                local_32c.id = *(uint32_t *)pTStack_308;
                TypedID<(spirv_cross::Types)0>::TypedID(&local_330,ptr._4_4_);
                SPIRFunction::add_parameter(this_00,local_32c,local_330,true);
                local_334 = StorageClassFunction;
                Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                          ((Compiler *)this,ptr._4_4_,&local_318,&local_334);
                TypedID<(spirv_cross::Types)0>::TypedID
                          ((TypedID<(spirv_cross::Types)0> *)&next_id_1,p_type._4_4_);
                pmVar14 = ::std::
                          unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                          ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                                       (key_type *)&next_id_1);
                pDVar13 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                                    (&(pmVar14->members).
                                      super_VectorView<spirv_cross::Meta::Decoration>,
                                     (ulong)(uint32_t)__range5);
                TypedID<(spirv_cross::Types)0>::TypedID(&local_33c,ptr._4_4_);
                pmVar14 = ::std::
                          unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                          ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,&local_33c
                                      );
                Meta::Decoration::operator=(&pmVar14->decoration,pDVar13);
              }
              __range5._0_4_ = (uint32_t)__range5 + 1;
            }
          }
          else {
            local_340 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1)
            ;
            TypedID<(spirv_cross::Types)1>::TypedID(&local_344,p_type._4_4_);
            TypedID<(spirv_cross::Types)0>::TypedID(&local_348,local_340);
            SPIRFunction::add_parameter(this_00,local_344,local_348,true);
            local_350[1] = 7;
            local_350[0] = 0;
            Compiler::
            set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int,unsigned_int&>
                      ((Compiler *)this,local_340,(uint *)((long)&p_type + 4),
                       (StorageClass *)(local_350 + 1),local_350,(uint *)((long)&var_1 + 4));
            TypedID<(spirv_cross::Types)0>::TypedID(&local_354,var_1._4_4_);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (local_398,this,(ulong)var_1._4_4_,1);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_3b8,"v",&local_3b9);
            ensure_valid_name((CompilerMSL *)local_378,(string *)this,local_398);
            Compiler::set_name((Compiler *)this,local_354,(string *)local_378);
            ::std::__cxx11::string::~string((string *)local_378);
            ::std::__cxx11::string::~string(local_3b8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
            ::std::__cxx11::string::~string((string *)local_398);
            TypedID<(spirv_cross::Types)0>::TypedID(&local_3c0,var_1._4_4_);
            pmVar14 = ::std::
                      unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                      ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,&local_3c0);
            TypedID<(spirv_cross::Types)0>::TypedID(&local_3c4,local_340);
            this_01 = ::std::
                      unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                      ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,&local_3c4);
            Meta::operator=(this_01,pmVar14);
          }
        }
        ::std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end2_1);
      }
    }
  }
  return;
}

Assistant:

void CompilerMSL::extract_global_variables_from_function(uint32_t func_id, std::set<uint32_t> &added_arg_ids,
                                                         unordered_set<uint32_t> &global_var_ids,
                                                         unordered_set<uint32_t> &processed_func_ids)
{
	// Avoid processing a function more than once
	if (processed_func_ids.find(func_id) != processed_func_ids.end())
	{
		// Return function global variables
		added_arg_ids = function_global_vars[func_id];
		return;
	}

	processed_func_ids.insert(func_id);

	auto &func = get<SPIRFunction>(func_id);

	// Recursively establish global args added to functions on which we depend.
	for (auto block : func.blocks)
	{
		auto &b = get<SPIRBlock>(block);
		for (auto &i : b.ops)
		{
			auto ops = stream(i);
			auto op = static_cast<Op>(i.op);

			switch (op)
			{
			case OpLoad:
			case OpInBoundsAccessChain:
			case OpAccessChain:
			case OpPtrAccessChain:
			case OpArrayLength:
			{
				uint32_t base_id = ops[2];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);

				// Use Metal's native frame-buffer fetch API for subpass inputs.
				auto &type = get<SPIRType>(ops[0]);
				if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData &&
				    (!msl_options.is_ios() || !msl_options.ios_use_framebuffer_fetch_subpasses))
				{
					// Implicitly reads gl_FragCoord.
					assert(builtin_frag_coord_id != 0);
					added_arg_ids.insert(builtin_frag_coord_id);
					if (msl_options.multiview)
					{
						// Implicitly reads gl_ViewIndex.
						assert(builtin_view_idx_id != 0);
						added_arg_ids.insert(builtin_view_idx_id);
					}
					else if (msl_options.arrayed_subpass_input)
					{
						// Implicitly reads gl_Layer.
						assert(builtin_layer_id != 0);
						added_arg_ids.insert(builtin_layer_id);
					}
				}

				break;
			}

			case OpFunctionCall:
			{
				// First see if any of the function call args are globals
				for (uint32_t arg_idx = 3; arg_idx < i.length; arg_idx++)
				{
					uint32_t arg_id = ops[arg_idx];
					if (global_var_ids.find(arg_id) != global_var_ids.end())
						added_arg_ids.insert(arg_id);
				}

				// Then recurse into the function itself to extract globals used internally in the function
				uint32_t inner_func_id = ops[2];
				std::set<uint32_t> inner_func_args;
				extract_global_variables_from_function(inner_func_id, inner_func_args, global_var_ids,
				                                       processed_func_ids);
				added_arg_ids.insert(inner_func_args.begin(), inner_func_args.end());
				break;
			}

			case OpStore:
			{
				uint32_t base_id = ops[0];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);

				uint32_t rvalue_id = ops[1];
				if (global_var_ids.find(rvalue_id) != global_var_ids.end())
					added_arg_ids.insert(rvalue_id);

				break;
			}

			case OpSelect:
			{
				uint32_t base_id = ops[3];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				base_id = ops[4];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				break;
			}

			// Emulate texture2D atomic operations
			case OpImageTexelPointer:
			{
				// When using the pointer, we need to know which variable it is actually loaded from.
				uint32_t base_id = ops[2];
				auto *var = maybe_get_backing_variable(base_id);
				if (var && atomic_image_vars.count(var->self))
				{
					if (global_var_ids.find(base_id) != global_var_ids.end())
						added_arg_ids.insert(base_id);
				}
				break;
			}

			default:
				break;
			}

			// TODO: Add all other operations which can affect memory.
			// We should consider a more unified system here to reduce boiler-plate.
			// This kind of analysis is done in several places ...
		}
	}

	function_global_vars[func_id] = added_arg_ids;

	// Add the global variables as arguments to the function
	if (func_id != ir.default_entry_point)
	{
		bool added_in = false;
		bool added_out = false;
		for (uint32_t arg_id : added_arg_ids)
		{
			auto &var = get<SPIRVariable>(arg_id);
			uint32_t type_id = var.basetype;
			auto *p_type = &get<SPIRType>(type_id);
			BuiltIn bi_type = BuiltIn(get_decoration(arg_id, DecorationBuiltIn));

			if (((is_tessellation_shader() && var.storage == StorageClassInput) ||
			     (get_execution_model() == ExecutionModelTessellationControl && var.storage == StorageClassOutput)) &&
			    !(has_decoration(arg_id, DecorationPatch) || is_patch_block(*p_type)) &&
			    (!is_builtin_variable(var) || bi_type == BuiltInPosition || bi_type == BuiltInPointSize ||
			     bi_type == BuiltInClipDistance || bi_type == BuiltInCullDistance ||
			     p_type->basetype == SPIRType::Struct))
			{
				// Tessellation control shaders see inputs and per-vertex outputs as arrays.
				// Similarly, tessellation evaluation shaders see per-vertex inputs as arrays.
				// We collected them into a structure; we must pass the array of this
				// structure to the function.
				std::string name;
				if (var.storage == StorageClassInput)
				{
					if (added_in)
						continue;
					name = "gl_in";
					arg_id = stage_in_ptr_var_id;
					added_in = true;
				}
				else if (var.storage == StorageClassOutput)
				{
					if (added_out)
						continue;
					name = "gl_out";
					arg_id = stage_out_ptr_var_id;
					added_out = true;
				}
				type_id = get<SPIRVariable>(arg_id).basetype;
				uint32_t next_id = ir.increase_bound_by(1);
				func.add_parameter(type_id, next_id, true);
				set<SPIRVariable>(next_id, type_id, StorageClassFunction, 0, arg_id);

				set_name(next_id, name);
			}
			else if (is_builtin_variable(var) && p_type->basetype == SPIRType::Struct)
			{
				// Get the pointee type
				type_id = get_pointee_type_id(type_id);
				p_type = &get<SPIRType>(type_id);

				uint32_t mbr_idx = 0;
				for (auto &mbr_type_id : p_type->member_types)
				{
					BuiltIn builtin = BuiltInMax;
					bool is_builtin = is_member_builtin(*p_type, mbr_idx, &builtin);
					if (is_builtin && has_active_builtin(builtin, var.storage))
					{
						// Add a arg variable with the same type and decorations as the member
						uint32_t next_ids = ir.increase_bound_by(2);
						uint32_t ptr_type_id = next_ids + 0;
						uint32_t var_id = next_ids + 1;

						// Make sure we have an actual pointer type,
						// so that we will get the appropriate address space when declaring these builtins.
						auto &ptr = set<SPIRType>(ptr_type_id, get<SPIRType>(mbr_type_id));
						ptr.self = mbr_type_id;
						ptr.storage = var.storage;
						ptr.pointer = true;
						ptr.parent_type = mbr_type_id;

						func.add_parameter(mbr_type_id, var_id, true);
						set<SPIRVariable>(var_id, ptr_type_id, StorageClassFunction);
						ir.meta[var_id].decoration = ir.meta[type_id].members[mbr_idx];
					}
					mbr_idx++;
				}
			}
			else
			{
				uint32_t next_id = ir.increase_bound_by(1);
				func.add_parameter(type_id, next_id, true);
				set<SPIRVariable>(next_id, type_id, StorageClassFunction, 0, arg_id);

				// Ensure the existing variable has a valid name and the new variable has all the same meta info
				set_name(arg_id, ensure_valid_name(to_name(arg_id), "v"));
				ir.meta[next_id] = ir.meta[arg_id];
			}
		}
	}
}